

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O3

Llb_Mnx_t * Llb_MnxStart(Aig_Man_t *pAig,Gia_ParLlb_t *pPars)

{
  int iVar1;
  Llb_Mnx_t *pLVar2;
  DdManager *unique;
  Vec_Int_t *pVVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  long lVar6;
  int iVar7;
  uint numVars;
  timespec ts;
  timespec local_38;
  
  pLVar2 = (Llb_Mnx_t *)calloc(1,0x80);
  pLVar2->pAig = pAig;
  pLVar2->pPars = pPars;
  iVar7 = pPars->TimeLimit;
  if ((long)iVar7 == 0) {
    lVar6 = 0;
  }
  else {
    iVar1 = clock_gettime(3,&local_38);
    if (iVar1 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
    }
    lVar6 = lVar6 + (long)iVar7 * 1000000;
  }
  pPars->TimeTarget = lVar6;
  if (pPars->fCluster == 0) {
    pVVar3 = Llb_Nonlin4CreateOrder(pAig);
    pLVar2->vOrder = pVVar3;
    if ((long)pVVar3->nSize < 1) {
      numVars = 1;
    }
    else {
      lVar6 = 0;
      iVar7 = 0;
      do {
        iVar7 = iVar7 + (uint)(0 < pVVar3->pArray[lVar6]);
        lVar6 = lVar6 + 1;
      } while (pVVar3->nSize != lVar6);
      numVars = iVar7 + 1;
    }
    unique = Cudd_Init(numVars,0,0x100,0x40000,0);
    pLVar2->dd = unique;
    Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
    Cudd_SetMaxGrowth(unique,1.05);
    unique->TimeStop = pPars->TimeTarget;
    pVVar4 = Llb_Nonlin4DerivePartitions(unique,pAig,pVVar3);
    pLVar2->vRoots = pVVar4;
  }
  else {
    Llb4_Nonlin4Sweep(pAig,pPars->nBddMax,pPars->nClusterMax,&pLVar2->dd,&pLVar2->vOrder,
                      &pLVar2->vRoots,pPars->fVerbose);
    unique = pLVar2->dd;
    unique->TimeStop = pLVar2->pPars->TimeTarget;
    pVVar3 = pLVar2->vOrder;
  }
  Llb_Nonlin4SetupVarMap(unique,pAig,pVVar3);
  pVVar3 = Llb_Nonlin4CreateVars2Q(pLVar2->dd,pAig,pLVar2->vOrder,pLVar2->pPars->fBackward);
  pLVar2->vVars2Q = pVVar3;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar4->pArray = ppvVar5;
  pLVar2->vRings = pVVar4;
  if (pPars->fReorder != 0) {
    Llb_Nonlin4Reorder(pLVar2->dd,0,1);
  }
  return pLVar2;
}

Assistant:

Llb_Mnx_t * Llb_MnxStart( Aig_Man_t * pAig, Gia_ParLlb_t * pPars )
{
    Llb_Mnx_t * p;

    p = ABC_CALLOC( Llb_Mnx_t, 1 );
    p->pAig    = pAig;
    p->pPars   = pPars;

    // compute time to stop
    p->pPars->TimeTarget = p->pPars->TimeLimit ? p->pPars->TimeLimit * CLOCKS_PER_SEC + Abc_Clock(): 0;

    if ( pPars->fCluster )
    {
//        Llb_Nonlin4Cluster( p->pAig, &p->dd, &p->vOrder, &p->vRoots, pPars->nBddMax, pPars->fVerbose );
//        Cudd_AutodynEnable( p->dd,  CUDD_REORDER_SYMM_SIFT );
        Llb4_Nonlin4Sweep( p->pAig, pPars->nBddMax, pPars->nClusterMax, &p->dd, &p->vOrder, &p->vRoots, pPars->fVerbose );
        // set the stop time parameter
        p->dd->TimeStop  = p->pPars->TimeTarget;
    }
    else
    {
//    p->vOrder  = Llb_Nonlin4CreateOrderSimple( pAig );
        p->vOrder  = Llb_Nonlin4CreateOrder( pAig );
        p->dd      = Cudd_Init( Vec_IntCountPositive(p->vOrder) + 1, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
        Cudd_AutodynEnable( p->dd,  CUDD_REORDER_SYMM_SIFT );
        Cudd_SetMaxGrowth( p->dd, 1.05 );
        // set the stop time parameter
        p->dd->TimeStop  = p->pPars->TimeTarget;
        p->vRoots  = Llb_Nonlin4DerivePartitions( p->dd, pAig, p->vOrder );
    }

    Llb_Nonlin4SetupVarMap( p->dd, pAig, p->vOrder );
    p->vVars2Q = Llb_Nonlin4CreateVars2Q( p->dd, pAig, p->vOrder, p->pPars->fBackward );
    p->vRings  = Vec_PtrAlloc( 100 );

    if ( pPars->fReorder )
        Llb_Nonlin4Reorder( p->dd, 0, 1 );
    return p;
}